

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

void test_bitset_lenrange_cardinality(void)

{
  int k_1;
  int k;
  uint64_t words [8];
  int in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t lenminusone;
  uint32_t start;
  uint64_t *words_00;
  unsigned_long result;
  
  memset(&stack0xffffffffffffffb8,0,0x40);
  words_00 = (uint64_t *)0xffffffffffffffff;
  result = 0xffffffffffffffff;
  for (start = 0; (int)start < 0x100; start = start + 1) {
    bitset_lenrange_cardinality(words_00,start,in_stack_ffffffffffffffb0);
    _assert_true(result,(char *)words_00,(char *)CONCAT44(start,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
  }
  for (lenminusone = 0x100; (int)lenminusone < 0x200; lenminusone = lenminusone + 1) {
    bitset_lenrange_cardinality(words_00,start,lenminusone);
    _assert_true(result,(char *)words_00,(char *)CONCAT44(start,lenminusone),
                 in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

DEFINE_TEST(test_bitset_lenrange_cardinality) {
    uint64_t words[] = {
        ~UINT64_C(0), ~UINT64_C(0), ~UINT64_C(0), ~UINT64_C(0), 0, 0, 0, 0};
    for (int k = 0; k < 64 * 4; k++) {
        assert_true(bitset_lenrange_cardinality(words, 0, k) == k + 1);  // ok
    }
    for (int k = 64 * 4; k < 64 * 8; k++) {
        assert_true(bitset_lenrange_cardinality(words, 0, k) == 4 * 64);  // ok
    }
}